

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void __thiscall gvr::PointCloud::loadPLY(PointCloud *this,PLYReader *ply)

{
  uint uVar1;
  bool bVar2;
  ply_type pVar3;
  long lVar4;
  string *in_RSI;
  PointCloud *in_RDI;
  FloatArrayReceiver sz;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver sc;
  FloatArrayReceiver se;
  FloatArrayReceiver ss;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver vx;
  int vn;
  size_t in_stack_fffffffffffff808;
  string *in_stack_fffffffffffff810;
  allocator *receiver;
  PLYReader *in_stack_fffffffffffff818;
  PLYReader *in_stack_fffffffffffff820;
  PLYReader *in_stack_fffffffffffff828;
  PLYReader *this_00;
  bool local_6cd;
  bool local_665;
  allocator local_619;
  string local_618 [39];
  allocator<char> local_5f1;
  string local_5f0 [39];
  allocator<char> local_5c9;
  string local_5c8 [16];
  PLYReader *in_stack_fffffffffffffa48;
  Model *in_stack_fffffffffffffa50;
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [135];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [135];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [133];
  byte local_22b;
  byte local_22a;
  allocator local_229;
  string local_228 [37];
  byte local_203;
  byte local_202;
  allocator local_201;
  string local_200 [37];
  byte local_1db;
  byte local_1da;
  allocator local_1d9;
  string local_1d8 [37];
  byte local_1b3;
  byte local_1b2;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [37];
  byte local_13b;
  byte local_13a;
  allocator local_139;
  string local_138 [37];
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [37];
  byte local_c3;
  byte local_c2;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  uint local_14;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"vertex",&local_39);
  lVar4 = PLYReader::instancesOfElement(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_14 = (uint)lVar4;
  Model::setOriginFromPLY(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  uVar1 = local_14;
  std::allocator<char>::allocator();
  local_c2 = 0;
  local_c3 = 0;
  local_ea = 0;
  local_eb = 0;
  local_112 = 0;
  local_113 = 0;
  local_13a = 0;
  local_13b = 0;
  std::__cxx11::string::string(local_70,"vertex",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"scan_size",&local_99);
  pVar3 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
                     &in_stack_fffffffffffff818->filename);
  local_665 = true;
  if (pVar3 == ply_none) {
    std::allocator<char>::allocator();
    local_c2 = 1;
    std::__cxx11::string::string(local_c0,"vertex",&local_c1);
    local_c3 = 1;
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string(local_e8,"scan_error",&local_e9);
    local_eb = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
                       &in_stack_fffffffffffff818->filename);
    local_665 = true;
    if (pVar3 == ply_none) {
      std::allocator<char>::allocator();
      local_112 = 1;
      std::__cxx11::string::string(local_110,"vertex",&local_111);
      local_113 = 1;
      std::allocator<char>::allocator();
      local_13a = 1;
      std::__cxx11::string::string(local_138,"scan_conf",&local_139);
      local_13b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
                         &in_stack_fffffffffffff818->filename);
      local_665 = pVar3 != ply_none;
    }
  }
  std::allocator<char>::allocator();
  local_1b2 = 0;
  local_1b3 = 0;
  local_1da = 0;
  local_1db = 0;
  local_202 = 0;
  local_203 = 0;
  local_22a = 0;
  local_22b = 0;
  std::__cxx11::string::string(local_160,"vertex",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"sx",&local_189);
  pVar3 = PLYReader::getTypeOfProperty
                    (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
                     &in_stack_fffffffffffff818->filename);
  local_6cd = false;
  if (pVar3 != ply_none) {
    std::allocator<char>::allocator();
    local_1b2 = 1;
    std::__cxx11::string::string(local_1b0,"vertex",&local_1b1);
    local_1b3 = 1;
    std::allocator<char>::allocator();
    local_1da = 1;
    std::__cxx11::string::string(local_1d8,"sy",&local_1d9);
    local_1db = 1;
    pVar3 = PLYReader::getTypeOfProperty
                      (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
                       &in_stack_fffffffffffff818->filename);
    local_6cd = false;
    if (pVar3 != ply_none) {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string(local_200,"vertex",&local_201);
      local_203 = 1;
      std::allocator<char>::allocator();
      local_22a = 1;
      std::__cxx11::string::string(local_228,"sz",&local_229);
      local_22b = 1;
      pVar3 = PLYReader::getTypeOfProperty
                        (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
                         &in_stack_fffffffffffff818->filename);
      local_6cd = pVar3 != ply_none;
    }
  }
  (*(in_RDI->super_Model)._vptr_Model[9])(in_RDI,(ulong)uVar1,(ulong)local_665,(ulong)local_6cd);
  if ((local_22b & 1) != 0) {
    std::__cxx11::string::~string(local_228);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
  }
  if ((local_203 & 1) != 0) {
    std::__cxx11::string::~string(local_200);
  }
  if ((local_202 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  if ((local_1db & 1) != 0) {
    std::__cxx11::string::~string(local_1d8);
  }
  if ((local_1da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  if ((local_1b3 & 1) != 0) {
    std::__cxx11::string::~string(local_1b0);
  }
  if ((local_1b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  if ((local_13b & 1) != 0) {
    std::__cxx11::string::~string(local_138);
  }
  if ((local_13a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  if ((local_113 & 1) != 0) {
    std::__cxx11::string::~string(local_110);
  }
  if ((local_112 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string(local_e8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if ((local_c3 & 1) != 0) {
    std::__cxx11::string::~string(local_c0);
  }
  if ((local_c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  getVertexArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  getVertexArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  getVertexArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"vertex",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"x",&local_2d9);
  PLYReader::setReceiver
            (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
             &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"vertex",&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"y",&local_329);
  PLYReader::setReceiver
            (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
             &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"vertex",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"z",&local_379);
  PLYReader::setReceiver
            (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
             &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  getScanPropArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  getScanPropArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  getScanPropArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  bVar2 = hasScanProp(in_RDI);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"vertex",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"scan_size",&local_429);
    PLYReader::setReceiver
              (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
               &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"vertex",&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"scan_error",&local_479);
    PLYReader::setReceiver
              (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
               &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"vertex",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"scan_conf",&local_4c9);
    PLYReader::setReceiver
              (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
               &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  getScanPosArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  getScanPosArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  getScanPosArray(in_RDI);
  FloatArrayReceiver::FloatArrayReceiver
            ((FloatArrayReceiver *)in_stack_fffffffffffff820,(float *)in_stack_fffffffffffff818,
             (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  bVar2 = hasScanPos(in_RDI);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"vertex",&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"sx",&local_579);
    PLYReader::setReceiver
              (in_stack_fffffffffffff828,&in_stack_fffffffffffff820->filename,
               &in_stack_fffffffffffff818->filename,(PLYReceiver *)in_stack_fffffffffffff810);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a0,"vertex",&local_5a1);
    this_00 = (PLYReader *)&local_5c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c8,"sy",(allocator *)this_00);
    PLYReader::setReceiver
              (this_00,&in_stack_fffffffffffff820->filename,&in_stack_fffffffffffff818->filename,
               (PLYReceiver *)in_stack_fffffffffffff810);
    std::__cxx11::string::~string(local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    std::__cxx11::string::~string(local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    in_stack_fffffffffffff820 = (PLYReader *)&local_5f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f0,"vertex",(allocator *)in_stack_fffffffffffff820);
    receiver = &local_619;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_618,"sz",receiver);
    PLYReader::setReceiver
              (this_00,&in_stack_fffffffffffff820->filename,local_10,(PLYReceiver *)receiver);
    std::__cxx11::string::~string(local_618);
    std::allocator<char>::~allocator((allocator<char> *)&local_619);
    std::__cxx11::string::~string(local_5f0);
    std::allocator<char>::~allocator(&local_5f1);
  }
  PLYReader::readData(in_stack_fffffffffffff820);
  return;
}

Assistant:

void PointCloud::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for point cloud

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  // read data

  ply.readData();
}